

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O2

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::HighOrderFunctionsFilter
               (TPZVec<int> *firstHCurlFunc,TPZVec<int> *conOrders,TPZVec<int> *filteredFuncs)

{
  int iVar1;
  int ifunc;
  uint uVar2;
  int iVar3;
  MElementType MVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ostream *poVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  
  uVar2 = pztopology::TPZTetrahedron::NumSides(2);
  iVar3 = pztopology::TPZTetrahedron::NumSides(1);
  (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,0);
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  uVar18 = 0;
  iVar16 = 0;
  do {
    if (uVar18 == uVar7) {
      iVar1 = conOrders->fStore[(int)(iVar3 + uVar2)];
      iVar3 = firstHCurlFunc->fStore[(int)(iVar3 + uVar2)];
      iVar17 = (iVar1 + -2) * (iVar1 + -1);
      iVar6 = (iVar1 * 2 + 3) * iVar17;
      (*filteredFuncs->_vptr_TPZVec[3])
                (filteredFuncs,(long)(iVar6 / 6 + iVar16),(long)iVar6 % 6 & 0xffffffff);
      piVar12 = filteredFuncs->fStore + iVar16;
      for (iVar6 = iVar17 / 2; iVar6 < iVar17 * 2; iVar6 = iVar6 + 1) {
        *piVar12 = iVar6 + iVar3;
        iVar16 = iVar16 + 1;
        piVar12 = piVar12 + 1;
      }
      iVar3 = iVar17 * 2 + iVar3;
      for (iVar6 = 4; iVar6 <= iVar1; iVar6 = iVar6 + 1) {
        uVar7 = (long)((iVar6 + -3) * (iVar6 * 3 + -6)) / 2;
        iVar17 = (int)uVar7;
        piVar12 = filteredFuncs->fStore;
        iVar10 = 0;
        uVar18 = 0;
        if (0 < iVar17) {
          uVar18 = uVar7 & 0xffffffff;
        }
        uVar7 = 0;
        iVar5 = iVar3;
        while( true ) {
          iVar14 = (int)uVar18;
          uVar18 = (ulong)(iVar14 - 1);
          if (iVar14 == 0) break;
          if ((int)(uVar7 / 3) * 3 + iVar10 != 0) {
            piVar12[iVar16] = iVar5;
            iVar16 = iVar16 + 1;
          }
          uVar7 = (ulong)((int)uVar7 + 1);
          iVar10 = iVar10 + -1;
          iVar5 = iVar5 + 1;
        }
        iVar3 = iVar3 + iVar17;
      }
      return;
    }
    lVar8 = (long)iVar3 + uVar18;
    iVar1 = firstHCurlFunc->fStore[lVar8];
    iVar6 = conOrders->fStore[lVar8];
    MVar4 = pztopology::TPZTetrahedron::Type((int)lVar8 + 4);
    if (MVar4 == EQuadrilateral) {
      (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,(long)((iVar6 + 2) * iVar6 + iVar16));
      iVar5 = 0;
      iVar17 = iVar1;
      iVar10 = 0;
      if (0 < iVar6) {
        iVar10 = iVar6;
      }
      for (; iVar5 != 3; iVar5 = iVar5 + 1) {
        piVar12 = filteredFuncs->fStore;
        for (lVar8 = 0; iVar14 = (int)lVar8, iVar10 != iVar14; lVar8 = lVar8 + 1) {
          piVar12[iVar16 + lVar8] = iVar17 + iVar14;
        }
        iVar16 = iVar16 + iVar14;
        iVar17 = iVar17 + iVar6;
      }
      iVar17 = iVar6 + -1;
      uVar11 = iVar17 * iVar17 * 2;
      piVar12 = filteredFuncs->fStore;
      uVar15 = 0;
      uVar13 = 0;
      if (0 < (int)uVar11) {
        uVar13 = uVar11;
      }
      for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        if ((uVar15 & 1) != 0) {
          piVar12[iVar16] = iVar1 + iVar6 * 4 + uVar15;
          iVar16 = iVar16 + 1;
        }
      }
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      piVar12 = filteredFuncs->fStore;
      for (lVar8 = 0; iVar10 = (int)lVar8, iVar17 != iVar10; lVar8 = lVar8 + 1) {
        piVar12[iVar16 + lVar8] = iVar6 * 5 + iVar1 + uVar11 + -1 + iVar10;
      }
      iVar16 = iVar16 + iVar10;
    }
    else {
      if (MVar4 != ETriangle) {
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "static void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::HighOrderFunctionsFilter(const TPZVec<int> &, const TPZVec<int> &, TPZVec<int> &) [TSHAPE = pzshape::TPZShapeTetra]"
                                );
        poVar9 = std::operator<<(poVar9," error. Not yet implemented");
        std::endl<char,std::char_traits<char>>(poVar9);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurlNoGrads.cpp"
                   ,0x138);
      }
      if (1 < iVar6) {
        (*filteredFuncs->_vptr_TPZVec[3])
                  (filteredFuncs,(long)(int)(((uint)((iVar6 + 2) * (iVar6 + -1)) >> 1) + iVar16));
        iVar17 = iVar1;
        for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
          piVar12 = filteredFuncs->fStore;
          for (lVar8 = 0; iVar5 = (int)lVar8, iVar6 + -1 != iVar5; lVar8 = lVar8 + 1) {
            piVar12[iVar16 + lVar8] = iVar17 + iVar5;
          }
          iVar16 = iVar16 + iVar5;
          iVar17 = iVar17 + iVar6 + -1;
        }
        uVar11 = (iVar6 + -2) * (iVar6 + -1);
        piVar12 = filteredFuncs->fStore;
        uVar13 = 0;
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
          if ((uVar13 & 1) != 0) {
            piVar12[iVar16] = iVar6 * 3 + iVar1 + -3 + uVar13;
            iVar16 = iVar16 + 1;
          }
        }
      }
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::HighOrderFunctionsFilter(
  const TPZVec<int> &firstHCurlFunc,
  const TPZVec<int> &conOrders,
  TPZVec<int> &filteredFuncs){
  
  constexpr auto dim = TSHAPE::Dimension;
  constexpr auto nNodes = TSHAPE::NCornerNodes;
  constexpr auto nConnects = TSHAPE::NSides - nNodes;
  const auto nFaces = TSHAPE::NumSides(2);
  const auto nEdges = TSHAPE::NumSides(1);

  filteredFuncs.Resize(0);
  /*
    face connects: 
  */
  auto fcount = 0;
  for(auto iface = 0; iface < nFaces; iface++){
    const auto icon = nEdges + iface;
    const auto side = icon + nNodes;
    const auto firstSideShape = firstHCurlFunc[icon];
    const auto order = conOrders[icon];

    switch(TSHAPE::Type(side)){
    case ETriangle:{
      //there are no face functions for k < 2
      if(order < 2) break;
      /**
         we remove one internal function for each h1 face function of order k+1
         since there are (k-1)(k-2)/2 functions per face in a face with order k,
         we remove k(k-1)/2.
         so:
         (k-1)*(k+1)-k*(k-1)/2 = (k-1)(k+2)/2.
      */
      const auto nfacefuncs =  (order - 1) * (order+2) / 2;
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 3(k-1) vfe funcs.
         that means that, at each k, there are 3 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{3};
      for (auto ie = 0; ie < nedges - 1; ie++){
        const int nfuncs = order-1;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /**
         there are already 2(k-1) filtered functions. we discarded (k-1).
         so that means we need more (k-1)(k-2)/2 functions, because
         2(k-1) + (k-1)(k-2)/2 = (k-1)(k+2)/2. 
         That means we can take exactly half of the phi_fi functions. 
         for each k, there are 2(k-2) phi_fi func. so...
      **/
      auto firstVfiK = firstSideShape + 3*(order-1);
      const auto nPhiFi = (order-1)*(order-2);
      for(auto ifunc = 0; ifunc < nPhiFi; ifunc++){
        if(ifunc%2 == 0) continue;//we always skip one of them
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      break;
    }
    case EQuadrilateral:{
      /*
        from the 2k(k+1) functions, we filter out k^2 gradients of h1, thus
        there are k(k+2) remaining functions.
        from the 2k(k-1) phi_Fi functions, we can remove half of them,
        that sums k(k-1). so, we remove aditionally k phi_Fe functions of a given edge.
        k(k-1) + 3k = k(k+2) as we wanted.

        we need to take into account x- and y -dirs
      */
      const auto nfacefuncs =  order * (order+2);
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 4k vfe funcs.
         that means that, at each k, there are 4 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge, which
         is associated with the x direction
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{4};
      for (auto ie = 0; ie < nedges-1; ie++){
        const int nfuncs = order;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /*now we take half of the phi_fi functions.
        there are 2(k-1)(k-1) scalar functions that will be multiplied by
        vectors in both the x and y directions. we will skip all in the x dir.
        and then, 2*(k-1) functions that will be half in x dir and half in y dir.
        we also skip all in the x dir
       */
      auto firstVfiK = firstSideShape + 4*order;
      const auto nPhiFiK = 2*(order-1)*(order-1);
      const auto nPhiFiK1 = (order-1); // we will have nPhiFiK1 in x and nPhiFiK1 in y
      for(auto ifunc = 0; ifunc < nPhiFiK; ifunc++){
        if(ifunc%2==0) continue;//we always skip the one in x dir
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      //taking only the ones in the y-dir
      for(auto ifunc = 0; ifunc < nPhiFiK1; ifunc++){
        filteredFuncs[fcount] = firstVfiK+nPhiFiK+nPhiFiK1+ifunc;
        fcount++;
      }
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      break;
    }
    default:
      PZError<<__PRETTY_FUNCTION__<<" error. Not yet implemented"<<std::endl;
      DebugStop();
    }

  }
  
  if constexpr (dim < 3) return;

  if constexpr (TSHAPE::Type() == ETetraedro){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)(k-2)(k-3)/6 functions in a h1 element with order k,
       we remove k(k-1)(k-2)/6.
       so:
       (k-1)(k-2)(k+1)/2 - k(k-1)(k-2)/6 = (k-1)(k-2)(2k+3)/6.

       since we will remove k(k-1)(k-2)/6, for each  k   we remove (k-1)(k-2)/2 funcs.

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   k-1                 new funcs
       phi_kf      2(k-1)(k-2)         2(k-2)(k-3)         4(k-2)
       phi_ki      (k-1)(k-2)(k-3)/2   (k-2)(k-3)(k-4)/2   3(k-2)(k-3)/2
            
       that means that if we remove, for each k, (k-2) phi_kf 
       (for instance, all phi_kf associated with a given face),
       we need to remove (k-1)(k-2)/2 - (k-2) = (k-2)(k-3)/2
       which is exactly one third of the phi_ki.
            
    */

    const auto nintfuncs =  (order - 1) * (order-2) * (2*order+ 3) / 6;

    filteredFuncs.Resize(fcount+nintfuncs);

    /**
       we will iterate over the phi_kf hcurl functions.
       we chose to remove all the functions for a given face
       since they are sorted by face, we can simply skip (k-1)(k-2)/2 functions...
    */
    const auto firstvkf = firstSideShape;
    const auto offset = (order-1)*(order-2)/2;
    const auto nvkf = 2*(order-1)*(order-2);
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions
    */

    auto firstVki = firstSideShape + nvkf;
    for(auto ik = 4; ik <= order; ik++){
      //we chose to remove all the functions for a given direction
      const auto newvki = 3*(ik-2)*(ik-3)/2;
      for(auto ifunc = 0; ifunc < newvki; ifunc++){
        if(ifunc%3 == 0) continue;
        filteredFuncs[fcount] = firstVki+ifunc;
        fcount++;
      }
      //we skip to the higher order ones
      firstVki += newvki;
    }
  }
  else if constexpr (TSHAPE::Type() == ECube){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)^3 functions in a h1 element with order k,
       we remove k^3
       so:
       3k^2(k+1) - k^3 = k^2(2k+3)

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   
       phi_kf      6k^2
       phi_ki      3k^2(k-1)

       if we remove all phi_kf associated with a given face (k^2 funcs)
       and all phi_ki associated with a given direction (k^2(k-1)),
       we have removed all k^3 functions that we needed to.
    */

    const auto nintfuncs =  order*order*(2*order+3);

    filteredFuncs.Resize(fcount+nintfuncs);


    const auto firstvkf = firstSideShape;
    
    const auto offset = order*order;//we skip the first face, z direction
    const auto nvkf = 6*order*order;
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions. we have them separated:
       3(k-1)^3 functions of order k and 3(k-1)(2k-1) ( (k-1)(2k-1) in each direction).
       we will filter all funcs in z direction
    */

    const auto firstVki = firstSideShape + nvkf;
    const auto nvkik = 3*(order-1)*(order-1)*(order-1);
    const auto nvkik1 = (order-1)*(2*order-1);//for each direction
    
    for(auto ifunc = 0; ifunc < nvkik; ifunc++){
      if(ifunc%3 == 2) continue;//skip z direction
      filteredFuncs[fcount] = firstVki+ifunc;
      fcount++;
    }

    const auto firstxfunc = firstVki+nvkik;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//x dir
      filteredFuncs[fcount] = firstxfunc+ifunc;
      fcount++;
    }
    const auto firstyfunc = firstxfunc+nvkik1;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//y dir
      filteredFuncs[fcount] = firstyfunc+ifunc;
      fcount++;
    }
  }
}